

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O3

int docall(lua_State *L,int narg,int nres)

{
  int iVar1;
  int iVar2;
  _union_1457 local_c8;
  sigset_t local_c0;
  undefined4 local_40;
  
  iVar1 = lua_gettop();
  iVar1 = iVar1 - narg;
  lua_pushcclosure(L,msghandler,0);
  lua_rotate(L,iVar1,1);
  local_c8.sa_handler = laction;
  local_40 = 0;
  globalL = L;
  sigemptyset(&local_c0);
  sigaction(2,(sigaction *)&local_c8,(sigaction *)0x0);
  iVar2 = lua_pcallk(L,narg,nres,iVar1,0,0);
  local_c8.sa_handler = (__sighandler_t)0x0;
  local_40 = 0;
  sigemptyset(&local_c0);
  sigaction(2,(sigaction *)&local_c8,(sigaction *)0x0);
  lua_rotate(L,iVar1,0xffffffff);
  lua_settop(L,0xfffffffe);
  return iVar2;
}

Assistant:

static int docall (lua_State *L, int narg, int nres) {
  int status;
  int base = lua_gettop(L) - narg;  /* function index */
  lua_pushcfunction(L, msghandler);  /* push message handler */
  lua_insert(L, base);  /* put it under function and args */
  globalL = L;  /* to be available to 'laction' */
  setsignal(SIGINT, laction);  /* set C-signal handler */
  status = lua_pcall(L, narg, nres, base);
  setsignal(SIGINT, SIG_DFL); /* reset C-signal handler */
  lua_remove(L, base);  /* remove message handler from the stack */
  return status;
}